

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.tab.cc
# Opt level: O3

string * __thiscall
tchecker::parsing::program::parser_t::yytnamerr__abi_cxx11_
          (string *__return_storage_ptr__,parser_t *this,char *yystr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  parser_t *ppVar4;
  size_t sVar5;
  parser_t *ppVar6;
  string *yyr;
  
  if (*(char *)&this->_vptr_parser_t == '\"') {
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    ppVar6 = this;
    do {
      ppVar4 = (parser_t *)((long)&ppVar6->_vptr_parser_t + 1);
      bVar2 = *(byte *)((long)&ppVar6->_vptr_parser_t + 1);
      if (bVar2 < 0x5c) {
        if (bVar2 == 0x22) {
          return __return_storage_ptr__;
        }
        if ((bVar2 == 0x27) || (bVar2 == 0x2c)) goto LAB_00193a3d;
      }
      else if (bVar2 == 0x5c) {
        if (*(char *)((long)&ppVar6->_vptr_parser_t + 2) != '\\') goto LAB_00193a3d;
        ppVar4 = (parser_t *)((long)&ppVar6->_vptr_parser_t + 2);
      }
      ppVar6 = ppVar4;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    } while( true );
  }
LAB_00193a50:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this,(long)&this->_vptr_parser_t + sVar5);
  return __return_storage_ptr__;
LAB_00193a3d:
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  goto LAB_00193a50;
}

Assistant:

std::string
  parser_t::yytnamerr_ (const char *yystr)
  {
    if (*yystr == '"')
      {
        std::string yyr;
        char const *yyp = yystr;

        for (;;)
          switch (*++yyp)
            {
            case '\'':
            case ',':
              goto do_not_strip_quotes;

            case '\\':
              if (*++yyp != '\\')
                goto do_not_strip_quotes;
              else
                goto append;

            append:
            default:
              yyr += *yyp;
              break;

            case '"':
              return yyr;
            }
      do_not_strip_quotes: ;
      }

    return yystr;
  }